

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_mask_pred_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_20340ce::AV1HighbdUpsampledPredTest_CheckOutput_Test::TestBody
          (AV1HighbdUpsampledPredTest_CheckOutput_Test *this)

{
  ACMRandom *this_00;
  anon_enum_8 aVar1;
  ushort uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint32_t uVar6;
  ParamType *pPVar7;
  uint subpel_x_q3;
  SEARCH_METHODS *message;
  uint subpel_y_q3;
  int i;
  long lVar8;
  uint uVar9;
  int width;
  int height;
  Message local_80;
  AssertHelper local_78;
  ulong local_70;
  ulong local_68;
  internal local_60 [8];
  undefined8 *local_58;
  AV1HighbdUpsampledPredTest_CheckOutput_Test *local_50;
  ulong local_48;
  ulong local_40;
  _func_void_macroblockd_ptr_AV1Common_ptr_int_int_mv_ptr_uchar_ptr_int_int_int_int_uchar_ptr_int_int_int
  *local_38;
  
  pPVar7 = testing::
           WithParamInterface<std::tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int,_int),_BLOCK_SIZE,_int>_>
           ::GetParam();
  local_38 = (pPVar7->
             super__Tuple_impl<0UL,_void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int,_int),_BLOCK_SIZE,_int>
             ).
             super__Head_base<0UL,_void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int,_int),_false>
             ._M_head_impl;
  pPVar7 = testing::
           WithParamInterface<std::tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int,_int),_BLOCK_SIZE,_int>_>
           ::GetParam();
  aVar1 = (pPVar7->
          super__Tuple_impl<0UL,_void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int,_int),_BLOCK_SIZE,_int>
          ).super__Tuple_impl<1UL,_BLOCK_SIZE,_int>.super__Head_base<1UL,_BLOCK_SIZE,_false>.
          _M_head_impl;
  pPVar7 = testing::
           WithParamInterface<std::tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int,_int),_BLOCK_SIZE,_int>_>
           ::GetParam();
  uVar9 = (pPVar7->
          super__Tuple_impl<0UL,_void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int,_int),_BLOCK_SIZE,_int>
          ).super__Tuple_impl<1UL,_BLOCK_SIZE,_int>.super__Tuple_impl<2UL,_int>.
          super__Head_base<2UL,_int,_false>._M_head_impl;
  local_68 = (ulong)uVar9;
  local_40 = (ulong)::block_size_wide[aVar1];
  local_48 = (ulong)::block_size_high[aVar1];
  this_00 = &(this->super_AV1HighbdUpsampledPredTest).super_AV1HighbdCompMaskPredTestBase.rnd_;
  uVar2 = ~(ushort)(-1 << ((byte)uVar9 & 0x1f));
  lVar8 = 0;
  do {
    uVar6 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
    (this->super_AV1HighbdUpsampledPredTest).super_AV1HighbdCompMaskPredTestBase.pred_[lVar8] =
         (ushort)(uVar6 >> 0xf) & uVar2;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x4000);
  lVar8 = 0;
  do {
    uVar6 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
    uVar5 = local_40;
    uVar4 = local_48;
    (this->super_AV1HighbdUpsampledPredTest).super_AV1HighbdCompMaskPredTestBase.ref_buffer_[lVar8]
         = (ushort)(uVar6 >> 0xf) & uVar2;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x4400);
  local_70 = 1;
  local_50 = this;
  do {
    uVar9 = 0;
    do {
      subpel_x_q3 = uVar9 & 7;
      subpel_y_q3 = uVar9 >> 3;
      width = (int)uVar5;
      height = (int)uVar4;
      aom_highbd_upsampled_pred_c
                ((MACROBLOCKD *)0x0,(AV1Common *)0x0,0,0,(MV *)0x0,
                 (uint8_t *)
                 ((ulong)(this->super_AV1HighbdUpsampledPredTest).
                         super_AV1HighbdCompMaskPredTestBase.comp_pred1_ >> 1),width,height,
                 subpel_x_q3,subpel_y_q3,
                 (uint8_t *)
                 ((ulong)(this->super_AV1HighbdUpsampledPredTest).
                         super_AV1HighbdCompMaskPredTestBase.ref_ >> 1),0x80,(int)local_68,
                 (int)local_70);
      (*local_38)((macroblockd *)0x0,(AV1Common *)0x0,0,0,(mv *)0x0,
                  (uchar *)((ulong)(this->super_AV1HighbdUpsampledPredTest).
                                   super_AV1HighbdCompMaskPredTestBase.comp_pred2_ >> 1),width,
                  height,subpel_x_q3,subpel_y_q3,
                  (uchar *)((ulong)(this->super_AV1HighbdUpsampledPredTest).
                                   super_AV1HighbdCompMaskPredTestBase.ref_ >> 1),0x80,(int)local_68
                  ,(int)local_70);
      local_80.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ =
           AV1HighbdCompMaskPredTestBase::CheckResult
                     ((AV1HighbdCompMaskPredTestBase *)this,width,height);
      local_78.data_._0_1_ = 1;
      testing::internal::CmpHelperEQ<bool,bool>
                (local_60,"CheckResult(w, h)","true",(bool *)&local_80,(bool *)&local_78);
      puVar3 = local_58;
      if (local_60[0] == (internal)0x0) {
        testing::Message::Message(&local_80);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (CONCAT71(local_80.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._1_7_,
                             local_80.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_1_) + 0x10),"sub (",5);
        std::ostream::operator<<
                  ((void *)(CONCAT71(local_80.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_80.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 0x10),subpel_x_q3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (CONCAT71(local_80.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._1_7_,
                             local_80.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_1_) + 0x10),",",1);
        std::ostream::operator<<
                  ((void *)(CONCAT71(local_80.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_80.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 0x10),subpel_y_q3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (CONCAT71(local_80.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._1_7_,
                             local_80.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_1_) + 0x10),")",1);
        if (local_58 == (undefined8 *)0x0) {
          message = "";
        }
        else {
          message = (SEARCH_METHODS *)*local_58;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/comp_mask_pred_test.cc"
                   ,0x295,(char *)message);
        testing::internal::AssertHelper::operator=(&local_78,&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if ((long *)CONCAT71(local_80.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._1_7_,
                             local_80.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_80.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._1_7_,
                                         local_80.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_1_) + 8))();
        }
        if (local_58 == (undefined8 *)0x0) {
          return;
        }
        if ((undefined8 *)*local_58 != local_58 + 2) {
          operator_delete((undefined8 *)*local_58);
        }
        operator_delete(local_58);
        return;
      }
      if (local_58 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_58 != local_58 + 2) {
          operator_delete((undefined8 *)*local_58);
        }
        operator_delete(puVar3);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != 0x40);
    uVar9 = (int)local_70 + 1;
    local_70 = (ulong)uVar9;
    if (uVar9 == 3) {
      return;
    }
  } while( true );
}

Assistant:

TEST_P(AV1HighbdUpsampledPredTest, CheckOutput) {
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1));
}